

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

uint32_t lzma_mf_hc3_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint8_t *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  lzma_match *plVar4;
  uint uVar5;
  uint32_t pos;
  uint len_limit;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t len_best;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t uVar13;
  
  uVar9 = mf->read_pos;
  uVar5 = mf->write_pos - uVar9;
  len_limit = mf->nice_len;
  if ((uVar5 < mf->nice_len) && (len_limit = uVar5, uVar5 < 3)) {
    if (mf->action == LZMA_RUN) {
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x133,"uint32_t lzma_mf_hc3_find(lzma_mf *, lzma_match *)");
    }
    move_pending(mf);
    uVar13 = 0;
  }
  else {
    puVar1 = mf->buffer;
    puVar2 = mf->hash;
    pos = mf->offset + uVar9;
    uVar6 = (uint)puVar1[(ulong)uVar9 + 1] ^ lzma_crc32_table[0][puVar1[uVar9]];
    uVar7 = uVar6 & 0x3ff;
    uVar5 = pos - puVar2[uVar7];
    cur = puVar1 + uVar9;
    uVar9 = (((uint)puVar1[(ulong)uVar9 + 2] << 8 ^ uVar6) & mf->hash_mask) + 0x400;
    uVar13 = puVar2[uVar9];
    puVar2[uVar7] = pos;
    puVar2[uVar9] = pos;
    uVar9 = mf->cyclic_size;
    len_best = 2;
    if ((uVar5 < uVar9) && (cur[-(ulong)uVar5] == *cur)) {
      if (len_limit < 2) {
        __assert_fail("len <= limit",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2e,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if ((int)len_limit < 0) {
        __assert_fail("limit <= UINT32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2f,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      uVar6 = 2;
      uVar8 = len_best;
      do {
        len_best = len_limit;
        if (len_limit <= uVar6) break;
        lVar10 = *(long *)(cur + -(ulong)uVar5 + uVar6);
        uVar11 = (ulong)uVar6;
        uVar12 = lVar10 - *(long *)(cur + uVar11);
        if (uVar12 == 0) {
          uVar6 = uVar6 + 8;
          len_best = uVar8;
        }
        else {
          uVar3 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar6 = ((uint)(uVar3 >> 3) & 0x1fffffff) + uVar6;
          if (uVar6 < len_limit) {
            len_best = uVar6;
          }
        }
        uVar8 = len_best;
      } while (lVar10 == *(long *)(cur + uVar11));
      matches->len = len_best;
      matches->dist = uVar5 - 1;
      lVar10 = 1;
      if (len_best == len_limit) {
        mf->son[mf->cyclic_pos] = uVar13;
        move_pos(mf);
        return 1;
      }
    }
    else {
      lVar10 = 0;
    }
    plVar4 = hc_find_func(len_limit,pos,cur,uVar13,mf->depth,mf->son,mf->cyclic_pos,uVar9,
                          matches + lVar10,len_best);
    uVar13 = (uint32_t)((ulong)((long)plVar4 - (long)matches) >> 3);
    move_pos(mf);
  }
  return uVar13;
}

Assistant:

extern uint32_t
lzma_mf_hc3_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(false, 3);

	hash_3_calc();

	const uint32_t delta2 = pos - mf->hash[hash_2_value];
	const uint32_t cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

	uint32_t len_best = 2;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = lzma_memcmplen(cur - delta2, cur,
				len_best, len_limit);

		matches[0].len = len_best;
		matches[0].dist = delta2 - 1;
		matches_count = 1;

		if (len_best == len_limit) {
			hc_skip();
			return 1; // matches_count
		}
	}

	hc_find(len_best);
}